

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denoise.c
# Opt level: O0

float rnnoise_process_frame(DenoiseState *st,float *out,float *in)

{
  int iVar1;
  float local_3e88;
  float alpha;
  int silence;
  float vad_prob;
  float gf [481];
  float local_36e8 [2];
  float g [22];
  float local_3688 [2];
  float features [42];
  float local_35d8 [2];
  float Exp [22];
  float local_3578 [2];
  float Ep [22];
  float local_3518 [2];
  float Ex [22];
  float local_34b8 [2];
  float x [480];
  kiss_fft_cpx P [960];
  kiss_fft_cpx X [481];
  int local_24;
  int i;
  float *in_local;
  float *out_local;
  DenoiseState *st_local;
  
  memset(&silence,0,0x784);
  silence = 0x3f800000;
  alpha = 0.0;
  biquad(local_34b8,st->mem_hp_x,in,rnnoise_process_frame::b_hp,rnnoise_process_frame::a_hp,0x1e0);
  iVar1 = compute_frame_features
                    (st,P + 0x3bf,(kiss_fft_cpx *)(x + 0x1de),local_3518,local_3578,local_35d8,
                     local_3688,local_34b8);
  if (iVar1 == 0) {
    compute_rnn(&st->rnn,local_36e8,&alpha,local_3688);
    pitch_filter(P + 0x3bf,(kiss_fft_cpx *)(x + 0x1de),local_3518,local_3578,local_35d8,local_36e8);
    for (local_24 = 0; local_24 < 0x16; local_24 = local_24 + 1) {
      if (local_36e8[local_24] <= st->lastg[local_24] * 0.6) {
        local_3e88 = st->lastg[local_24] * 0.6;
      }
      else {
        local_3e88 = local_36e8[local_24];
      }
      local_36e8[local_24] = local_3e88;
      st->lastg[local_24] = local_36e8[local_24];
    }
    interp_band_gain((float *)&silence,local_36e8);
    for (local_24 = 0; local_24 < 0x1e1; local_24 = local_24 + 1) {
      P[(long)local_24 + 0x3bf].r = (float)(&silence)[local_24] * P[(long)local_24 + 0x3bf].r;
      P[(long)local_24 + 0x3bf].i = (float)(&silence)[local_24] * P[(long)local_24 + 0x3bf].i;
    }
  }
  frame_synthesis(st,out,P + 0x3bf);
  return alpha;
}

Assistant:

float rnnoise_process_frame(DenoiseState *st, float *out, const float *in) {
    int i;
    kiss_fft_cpx X[FREQ_SIZE];
    kiss_fft_cpx P[WINDOW_SIZE];
    float x[FRAME_SIZE];
    float Ex[NB_BANDS], Ep[NB_BANDS];
    float Exp[NB_BANDS];
    float features[NB_FEATURES];
    float g[NB_BANDS];
    float gf[FREQ_SIZE] = {1};
    float vad_prob = 0;
    int silence;
    static const float a_hp[2] = {-1.99599, 0.99600};
    static const float b_hp[2] = {-2, 1};
    biquad(x, st->mem_hp_x, in, b_hp, a_hp, FRAME_SIZE); // high pass 高通滤波 抑制50Hz或60Hz的电源干扰
    silence = compute_frame_features(st, X, P, Ex, Ep, Exp, features, x);

    if (!silence) { // 非静音帧
        compute_rnn(&st->rnn, g, &vad_prob, features);
        pitch_filter(X, P, Ex, Ep, Exp, g);
        for (i = 0; i < NB_BANDS; i++) {
            float alpha = .6f;
            g[i] = MAX16(g[i], alpha * st->lastg[i]);
            st->lastg[i] = g[i];
        }
        interp_band_gain(gf, g);
#if 1
        for (i = 0; i < FREQ_SIZE; i++) {
            X[i].r *= gf[i];
            X[i].i *= gf[i];
        }
#endif
    }
    frame_synthesis(st, out, X);
    return vad_prob;
}